

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_low_impl.h
# Opt level: O2

void secp256k1_scalar_cmov(secp256k1_scalar *r,secp256k1_scalar *a,int flag)

{
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  
  secp256k1_scalar_verify(a);
  *r = -flag & *a | flag - 1U & *r;
  secp256k1_scalar_verify(r);
  return;
}

Assistant:

static SECP256K1_INLINE void secp256k1_scalar_cmov(secp256k1_scalar *r, const secp256k1_scalar *a, int flag) {
    uint32_t mask0, mask1;
    volatile int vflag = flag;
    SECP256K1_SCALAR_VERIFY(a);
    SECP256K1_CHECKMEM_CHECK_VERIFY(r, sizeof(*r));

    mask0 = vflag + ~((uint32_t)0);
    mask1 = ~mask0;
    *r = (*r & mask0) | (*a & mask1);

    SECP256K1_SCALAR_VERIFY(r);
}